

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
vk::BinaryRegistryDetail::anon_unknown_8::getSearchPath
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ProgramIdentifier *id)

{
  pointer pcVar1;
  ulong __n;
  long *plVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *extraout_RAX;
  long *plVar4;
  __string_type __str;
  string combinedStr;
  allocator_type local_61;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  long *local_40;
  ulong local_38;
  long local_30;
  long lStack_28;
  
  pcVar1 = (id->testCasePath)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (id->testCasePath)._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_60,(ulong)(id->programName)._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar2[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  __n = local_38;
  local_60 = (long *)((ulong)local_60 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(local_38 >> 2) + 1,(value_type_conflict2 *)&local_60,&local_61)
  ;
  pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           memcpy((__return_storage_ptr__->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start,local_40,__n);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
    pvVar3 = extraout_RAX;
  }
  return pvVar3;
}

Assistant:

std::vector<deUint32> getSearchPath (const ProgramIdentifier& id)
{
	const std::string	combinedStr		= id.testCasePath + '#' + id.programName;
	const size_t		strLen			= combinedStr.size();
	const size_t		numWords		= strLen/4 + 1;		// Must always end up with at least one 0 byte
	vector<deUint32>	words			(numWords, 0u);

	deMemcpy(&words[0], combinedStr.c_str(), strLen);

	return words;
}